

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distribution.cpp
# Opt level: O0

void test_distribute<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,MxxDistribution_DistributePairVector_Test::TestBody()::__0>
               (comm *size,comm *param_2,undefined8 param_3,comm *param_4)

{
  pointer ppVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  unsigned_long uVar5;
  reference pvVar6;
  char *pcVar7;
  iterator iVar8;
  iterator iVar9;
  T TVar10;
  AssertHelper local_158;
  Message local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_3;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_2;
  T expected;
  size_t i_1;
  AssertHelper local_e8;
  Message local_e0;
  size_type local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_b8;
  Message local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  size_t eq_prefix;
  size_t eq_size;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> eq_distr;
  comm *local_60;
  size_t i;
  undefined1 local_48 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> vec;
  size_t total_size;
  size_t prefix;
  comm *c_local;
  size_t size_local;
  
  c_local = size;
  uVar5 = mxx::exscan<unsigned_long>((unsigned_long *)&c_local,param_2);
  vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)mxx::allreduce<unsigned_long>((unsigned_long *)&c_local,param_2);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_48);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_48,
             (size_type)c_local);
  iVar3 = mxx::comm::rank(param_2);
  srand(iVar3 * 0xd);
  for (local_60 = (comm *)0x0; local_60 < c_local;
      local_60 = (comm *)((long)&local_60->_vptr_comm + 1)) {
    eq_distr.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)MxxDistribution_DistributePairVector_Test::TestBody::anon_class_1_0_00000001::
                  operator()((anon_class_1_0_00000001 *)((long)&size_local + 7),
                             (long)&local_60->_vptr_comm + uVar5);
    pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        local_48,(size_type)local_60);
    std::pair<int,_int>::operator=
              (pvVar6,(type)&eq_distr.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  mxx::distribute<std::pair<int,int>>
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&eq_size,
             (mxx *)local_48,
             (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)param_2,param_4);
  mxx::distribute_inplace<std::pair<int,int>>
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_48,param_2)
  ;
  ppVar1 = vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  iVar3 = mxx::comm::size(param_2);
  eq_prefix = (ulong)ppVar1 / (ulong)(long)iVar3;
  iVar3 = mxx::comm::rank(param_2);
  ppVar1 = vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  iVar4 = mxx::comm::size(param_2);
  if ((ulong)(long)iVar3 < (ulong)ppVar1 % (ulong)(long)iVar4) {
    eq_prefix = eq_prefix + 1;
  }
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       mxx::exscan<unsigned_long>(&eq_prefix,param_2);
  local_a8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        &eq_size);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_a0,"eq_size","eq_distr.size()",&eq_prefix,&local_a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar2) {
    testing::Message::Message(&local_b0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_distribution.cpp"
               ,0x36,pcVar7);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_d8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          local_48);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_d0,"eq_size","vec.size()",&eq_prefix,&local_d8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
    if (!bVar2) {
      testing::Message::Message(&local_e0);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_distribution.cpp"
                 ,0x37,pcVar7);
      testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      testing::Message::~Message(&local_e0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      iVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         local_48);
      iVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         local_48);
      mxx::
      sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )iVar8._M_current,
                 (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )iVar9._M_current,param_2);
      iVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         &eq_size);
      iVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         &eq_size);
      mxx::
      sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )iVar8._M_current,
                 (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )iVar9._M_current,param_2);
      expected.first = 0;
      expected.second = 0;
      for (; TVar10 = (T)std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                         size((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              &eq_size), (ulong)expected < (ulong)TVar10;
          expected = (T)((long)expected + 1)) {
        gtest_ar_2.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             MxxDistribution_DistributePairVector_Test::TestBody::anon_class_1_0_00000001::
             operator()((anon_class_1_0_00000001 *)((long)&size_local + 7),
                        (size_t)(&(gtest_ar.message_.ptr_)->_M_dataplus + (long)expected));
        pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            &eq_size,(size_type)expected);
        testing::internal::EqHelper<false>::Compare<std::pair<int,int>,std::pair<int,int>>
                  ((EqHelper<false> *)local_128,"expected","eq_distr[i]",
                   (pair<int,_int> *)&gtest_ar_2.message_,pvVar6);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
        if (!bVar2) {
          testing::Message::Message(&local_130);
          pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_distribution.cpp"
                     ,0x3e,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_3.message_,&local_130);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_130);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
        if (gtest_ar_1.message_.ptr_._4_4_ != 0) goto LAB_00111b4c;
        pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            local_48,(size_type)expected);
        testing::internal::EqHelper<false>::Compare<std::pair<int,int>,std::pair<int,int>>
                  ((EqHelper<false> *)local_148,"expected","vec[i]",
                   (pair<int,_int> *)&gtest_ar_2.message_,pvVar6);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
        if (!bVar2) {
          testing::Message::Message(&local_150);
          pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
          testing::internal::AssertHelper::AssertHelper
                    (&local_158,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_distribution.cpp"
                     ,0x3f,pcVar7);
          testing::internal::AssertHelper::operator=(&local_158,&local_150);
          testing::internal::AssertHelper::~AssertHelper(&local_158);
          testing::Message::~Message(&local_150);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
        if (gtest_ar_1.message_.ptr_._4_4_ != 0) goto LAB_00111b4c;
      }
      gtest_ar_1.message_.ptr_._4_4_ = 0;
    }
  }
LAB_00111b4c:
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&eq_size);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_48);
  return;
}

Assistant:

void test_distribute(size_t size, Func gen, const mxx::comm& c) {
    size_t prefix = mxx::exscan(size, c);
    size_t total_size = mxx::allreduce(size, c);

    typedef typename Container::value_type T;
    Container vec;
    vec.resize(size);
    std::srand(13*c.rank());
    for (size_t i = 0; i < size; ++i) {
        vec[i] = gen(prefix+i);
    }

    // stable distribute
    Container eq_distr = mxx::distribute(vec, c);
    mxx::distribute_inplace(vec, c);

    // get expected size
    size_t eq_size = total_size / c.size();
    if ((size_t)c.rank() < total_size % c.size())
        eq_size+=1;
    size_t eq_prefix = mxx::exscan(eq_size, c);

    ASSERT_EQ(eq_size, eq_distr.size());
    ASSERT_EQ(eq_size, vec.size());

    mxx::sort(vec.begin(), vec.end(), c);
    mxx::sort(eq_distr.begin(), eq_distr.end(), c);

    for (size_t i = 0; i < eq_distr.size(); ++i) {
        T expected = gen(eq_prefix+i);
        ASSERT_EQ(expected, eq_distr[i]);
        ASSERT_EQ(expected, vec[i]);
    }
}